

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<kratos::Var,_std::shared_ptr<kratos::Var>_> * __thiscall
pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>::
def<init_common_expr(pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>&)::__49,pybind11::return_value_policy>
          (class_<kratos::Var,std::shared_ptr<kratos::Var>> *this,char *name_,type *f,
          return_value_policy *extra)

{
  type *f_00;
  handle local_68;
  PyObject *local_60;
  handle local_58;
  handle local_50;
  sibling local_48;
  is_method local_40;
  name local_38;
  cpp_function local_30;
  cpp_function cf;
  return_value_policy *extra_local;
  type *f_local;
  char *name__local;
  class_<kratos::Var,_std::shared_ptr<kratos::Var>_> *this_local;
  
  cf.super_function.super_object.super_handle.m_ptr = (function)(function)extra;
  f_00 = method_adaptor<kratos::Var,init_common_expr(pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>&)::__49>
                   (f);
  pybind11::name::name(&local_38,name_);
  is_method::is_method(&local_40,(handle *)this);
  local_58.m_ptr = *(PyObject **)this;
  none::none((none *)&local_68);
  local_60 = local_68.m_ptr;
  getattr((pybind11 *)&local_50,local_58,name_,local_68);
  sibling::sibling(&local_48,&local_50);
  cpp_function::
  cpp_function<init_common_expr(pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>&)::__49,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy,void>
            (&local_30,f_00,&local_38,&local_40,&local_48,
             (return_value_policy *)cf.super_function.super_object.super_handle.m_ptr);
  object::~object((object *)&local_50);
  none::~none((none *)&local_68);
  pybind11::detail::add_class_method((object *)this,name_,&local_30);
  cpp_function::~cpp_function(&local_30);
  return (class_<kratos::Var,_std::shared_ptr<kratos::Var>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }